

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Stress::anon_unknown_0::RenderCase::checkResultImage(RenderCase *this,Surface *result)

{
  ostringstream *poVar1;
  void *pvVar2;
  TestLog *pTVar3;
  int y;
  int iVar4;
  size_t __n;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  bool bVar5;
  int iVar6;
  LogImageSet *this_00;
  undefined4 uVar7;
  bool bVar8;
  allocator<char> local_34e;
  allocator<char> local_34d;
  allocator<char> local_34c;
  allocator<char> local_34b;
  allocator<char> local_34a;
  allocator<char> local_349;
  string local_348;
  string local_328;
  undefined1 local_308 [32];
  Surface errorMask;
  string local_2d0;
  string local_2b0;
  string local_290;
  LogImageSet local_270;
  LogImage local_230;
  MessageBuilder local_1a0;
  
  tcu::Surface::Surface(&errorMask,0x100,0x100);
  local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Verifying output image.");
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  pvVar2 = (result->m_pixels).m_ptr;
  bVar5 = false;
  __n = 0;
  while (iVar4 = (int)__n, iVar4 != 0x100) {
    for (iVar6 = 0; iVar6 != 0x100; iVar6 = iVar6 + 1) {
      bVar8 = (~*(uint *)((long)pvVar2 + (long)(result->m_width * iVar4 + iVar6) * 4) & 0xff00) != 0
      ;
      uVar7 = 0xff00ff00;
      if (bVar8) {
        uVar7 = 0xff0000ff;
      }
      bVar5 = (bool)(bVar5 | bVar8);
      *(undefined4 *)
       ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar4 + iVar6) * 4) = uVar7;
    }
    __n = (size_t)(iVar4 + 1);
  }
  if (bVar5) {
    local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Result image has missing or invalid pixels");
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_308,"Results",&local_34e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"Result verification",&local_349);
    tcu::LogImageSet::LogImageSet(&local_270,(string *)local_308,&local_328);
    iVar4 = (int)pTVar3;
    tcu::LogImageSet::write(&local_270,iVar4,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"Result",&local_34a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"Result",&local_34b);
    tcu::LogImage::LogImage
              ((LogImage *)&local_1a0,&local_348,&local_290,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&local_1a0,iVar4,__buf_00,(size_t)result);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Error mask",&local_34c)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Error mask",&local_34d)
    ;
    surface = &errorMask;
    tcu::LogImage::LogImage(&local_230,&local_2b0,&local_2d0,surface,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_230,iVar4,__buf_01,(size_t)surface);
    tcu::TestLog::endImageSet(pTVar3);
    tcu::LogImage::~LogImage(&local_230);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    tcu::LogImage::~LogImage((LogImage *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_348);
    tcu::LogImageSet::~LogImageSet(&local_270);
    std::__cxx11::string::~string((string *)&local_328);
    this_00 = (LogImageSet *)local_308;
  }
  else {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"Results",(allocator<char> *)&local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_308,"Result verification",(allocator<char> *)&local_2b0);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_230,&local_270.m_name,(string *)local_308);
    iVar4 = (int)pTVar3;
    tcu::LogImageSet::write((LogImageSet *)&local_230,iVar4,__buf_02,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"Result",(allocator<char> *)&local_2d0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"Result",&local_34e);
    tcu::LogImage::LogImage
              ((LogImage *)&local_1a0,&local_328,&local_348,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&local_1a0,iVar4,__buf_03,(size_t)result);
    tcu::TestLog::endImageSet(pTVar3);
    tcu::LogImage::~LogImage((LogImage *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_328);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_230);
    std::__cxx11::string::~string((string *)local_308);
    this_00 = &local_270;
  }
  std::__cxx11::string::~string((string *)this_00);
  tcu::Surface::~Surface(&errorMask);
  return (bool)~bVar5;
}

Assistant:

bool RenderCase::checkResultImage (const tcu::Surface& result)
{
	tcu::Surface	errorMask	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	bool			error		= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output image." << tcu::TestLog::EndMessage;

	for (int y = 0; y < TEST_CANVAS_SIZE; ++y)
	for (int x = 0; x < TEST_CANVAS_SIZE; ++x)
	{
		const tcu::RGBA col = result.getPixel(x, y);

		if (col.getGreen() == 255)
			errorMask.setPixel(x, y, tcu::RGBA::green());
		else
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			error = true;
		}
	}

	if (error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Result image has missing or invalid pixels" << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result",		"Result",		result)
			<< tcu::TestLog::Image("Error mask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result", "Result", result)
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}